

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MallocV.cpp
# Opt level: O1

void __thiscall
adios2::format::MallocV::MallocV
          (MallocV *this,string *type,bool AlwaysCopy,size_t MemAlign,size_t MemBlockSize,
          size_t InitialBufferSize,double GrowthFactor)

{
  pointer pcVar1;
  string local_50;
  
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  pcVar1 = (type->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar1,pcVar1 + type->_M_string_length);
  BufferV::BufferV(&this->super_BufferV,&local_50,AlwaysCopy,MemAlign,MemBlockSize);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  (this->super_BufferV)._vptr_BufferV = (_func_int **)&PTR__MallocV_00883da8;
  this->m_InternalBlock = (char *)0x0;
  this->m_AllocatedSize = 0;
  this->m_InitialBufferSize = InitialBufferSize;
  this->m_GrowthFactor = GrowthFactor;
  return;
}

Assistant:

MallocV::MallocV(const std::string type, const bool AlwaysCopy, const size_t MemAlign,
                 const size_t MemBlockSize, size_t InitialBufferSize, double GrowthFactor)
: BufferV(type, AlwaysCopy, MemAlign, MemBlockSize), m_InitialBufferSize(InitialBufferSize),
  m_GrowthFactor(GrowthFactor)
{
}